

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessProgramPipelinesTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::ProgramPipelines::DefaultsTest::iterate(DefaultsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar11;
  ContextInfo *this_00;
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  DefaultsTest *this_local;
  
  pRVar11 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar11->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || (bVar2)) {
    prepare(this);
    bVar1 = testProgramPipelineParameter(this,0x8259,0);
    bVar2 = testProgramPipelineParameter(this,0x8b31,0);
    bVar3 = testProgramPipelineParameter(this,0x8dd9,0);
    bVar4 = testProgramPipelineParameter(this,0x8b30,0);
    bVar5 = testProgramPipelineParameter(this,0x91b9,0);
    bVar6 = testProgramPipelineParameter(this,0x8e88,0);
    bVar7 = testProgramPipelineParameter(this,0x8e87,0);
    bVar8 = testProgramPipelineParameter(this,0x8b83,0);
    bVar9 = testProgramPipelineParameter(this,0x8b84,0);
    bVar10 = testProgramPipelineInfoLog(this,(GLchar *)0x0);
    clean(this);
    if ((bVar9 && (bVar8 && (bVar7 && (bVar6 && (bVar5 && (bVar4 && (bVar3 && (bVar2 && bVar1)))))))
        ) && bVar10) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DefaultsTest::iterate()
{
	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		prepare();

		is_ok &= testProgramPipelineParameter(GL_ACTIVE_PROGRAM, 0);
		is_ok &= testProgramPipelineParameter(GL_VERTEX_SHADER, 0);
		is_ok &= testProgramPipelineParameter(GL_GEOMETRY_SHADER, 0);
		is_ok &= testProgramPipelineParameter(GL_FRAGMENT_SHADER, 0);
		is_ok &= testProgramPipelineParameter(GL_COMPUTE_SHADER, 0);
		is_ok &= testProgramPipelineParameter(GL_TESS_CONTROL_SHADER, 0);
		is_ok &= testProgramPipelineParameter(GL_TESS_EVALUATION_SHADER, 0);
		is_ok &= testProgramPipelineParameter(GL_VALIDATE_STATUS, 0);
		is_ok &= testProgramPipelineParameter(GL_INFO_LOG_LENGTH, 0);

		is_ok &= testProgramPipelineInfoLog(DE_NULL);
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}